

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

unsigned_long __thiscall
CVmObjByteArray::read_from_file
          (CVmObjByteArray *this,vm_obj_id_t self,CVmDataSource *fp,unsigned_long start_idx,
          unsigned_long len,int undo)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long cnt;
  unsigned_long uVar5;
  
  if (start_idx == 0) {
    err_throw(0x7df);
  }
  uVar3 = (ulong)*(uint *)(this->super_CVmObject).ext_;
  if (len == 0 || uVar3 < start_idx) {
    uVar5 = 0;
  }
  else {
    cnt = (uVar3 - start_idx) + 1;
    if ((start_idx + len) - 1 <= uVar3) {
      cnt = len;
    }
    if (undo != 0) {
      save_undo(this,self,start_idx,cnt);
    }
    uVar5 = 0;
    do {
      if (cnt == 0) {
        return uVar5;
      }
      uVar1 = (uint)(start_idx - 1);
      uVar4 = (ulong)(uVar1 & 0x7fff);
      uVar3 = 0x8000 - uVar4;
      if (cnt <= uVar3) {
        uVar3 = cnt;
      }
      iVar2 = (*fp->_vptr_CVmDataSource[3])
                        (fp,uVar4 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                       (start_idx - 1 >> 0x1c) * 8 + 4) +
                                             (ulong)(uVar1 >> 0xc & 0xfff8)),uVar3);
      uVar5 = uVar5 + (long)iVar2;
      start_idx = start_idx + uVar3;
      cnt = cnt - uVar3;
    } while (uVar3 == (long)iVar2);
  }
  return uVar5;
}

Assistant:

unsigned long CVmObjByteArray::read_from_file(
    VMG_ vm_obj_id_t self, CVmDataSource *fp,
    unsigned long start_idx, unsigned long len, int undo)
{
    unsigned long rem;
    unsigned long idx;
    unsigned long total;

    /* make sure the starting index is at least 1 */
    if (start_idx < 1)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* 
     *   if the starting index is past the end of the array, there's nothing
     *   to do - just return success 
     */
    if (start_idx > get_element_count())
        return 0;

    /* if the requested length is zero, consider it a success */
    if (len == 0)
        return 0;

    /* 
     *   limit the request to the number of bytes available after the
     *   starting index 
     */
    if (start_idx + len - 1 > get_element_count())
        len = get_element_count() - start_idx + 1;

    /* save undo */
    if (undo)
        save_undo(vmg_ self, start_idx, len);

    /* keep going until we satisfy the request or run into a problem */
    for (idx = start_idx, rem = len, total = 0 ; rem != 0 ; )
    {
        unsigned char *p;
        size_t avail;
        size_t chunk;
        size_t cur_read;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit reading to the amount of the request remaining */
        chunk = avail;
        if (chunk > rem)
            chunk = (size_t)rem;

        /* read as much as we can of this chunk */
        cur_read = fp->readc(p, chunk);

        /* add this amount into the total so far */
        total += cur_read;

        /* 
         *   if we didn't get as much as we asked for, we must have reached
         *   the end of the file before satisfying the request - there's
         *   nothing more to be read in this case, so we can stop looping 
         */
        if (cur_read != chunk)
            break;

        /* move our counters past this chunk */
        idx += chunk;
        rem -= chunk;
    }

    /* return the total amount we read */
    return total;
}